

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::RenderMouseCursor
               (ImDrawList *draw_list,ImVec2 pos,float scale,ImGuiMouseCursor mouse_cursor,
               ImU32 col_fill,ImU32 col_border,ImU32 col_shadow)

{
  bool bVar1;
  ImFontAtlas *this;
  uint in_ECX;
  int in_ESI;
  ImFontAtlasCustomRect *in_RDI;
  int in_R8D;
  ImTextureID tex_id;
  ImVec2 uv [4];
  ImVec2 size;
  ImVec2 offset;
  ImFontAtlas *font_atlas;
  undefined4 in_stack_fffffffffffffe48;
  int iVar2;
  undefined4 in_stack_fffffffffffffe4c;
  ImDrawList *in_stack_fffffffffffffe50;
  ImVec2 *this_00;
  undefined4 in_stack_fffffffffffffe60;
  float _x;
  ImVec2 *this_01;
  ImDrawIdx *user_texture_id;
  ImDrawList *in_stack_fffffffffffffe80;
  ImDrawList *this_02;
  ImU32 IVar3;
  undefined8 in_stack_fffffffffffffe90;
  ImVec2 *this_03;
  ImVec2 *in_stack_fffffffffffffed0;
  ImVec2 *in_stack_fffffffffffffed8;
  ImVec2 *in_stack_fffffffffffffee0;
  ImFontAtlas *this_04;
  ImFontAtlas *pIVar4;
  ImVec2 local_e0;
  ImVec2 local_d8;
  ImVec2 local_d0;
  ImVec2 local_c8;
  undefined1 local_c0 [24];
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 local_78;
  ImDrawIdx *local_70;
  undefined1 local_68 [40];
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  int local_24;
  uint local_20;
  ImFontAtlasCustomRect *local_10;
  ImVec2 local_8;
  
  if (in_ESI != -1) {
    local_30 = *(ImVec2 *)(*(long *)((long)*(ImVec2 *)((long)(in_RDI + 1) + 0x18) + 8) + 0x40);
    local_24 = in_R8D;
    local_20 = in_ECX;
    local_10 = in_RDI;
    ImVec2::ImVec2(&local_38);
    ImVec2::ImVec2(&local_40);
    pIVar4 = (ImFontAtlas *)((ImVec2 *)local_68 + 4);
    this = (ImFontAtlas *)local_68;
    do {
      this_04 = this;
      ImVec2::ImVec2((ImVec2 *)this_04);
      IVar3 = (ImU32)in_stack_fffffffffffffe90;
      this = (ImFontAtlas *)&this_04->TexID;
    } while (this != pIVar4);
    bVar1 = ImFontAtlas::GetMouseCursorTexData
                      (this,(ImGuiMouseCursor)((ulong)pIVar4 >> 0x20),(ImVec2 *)this_04,
                       in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0
                      );
    if (bVar1) {
      operator-=(&local_8,&local_38);
      local_70 = *(ImDrawIdx **)((long)local_30 + 8);
      ImDrawList::PushTextureID
                (in_stack_fffffffffffffe50,
                 (ImTextureID)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      this_00 = &local_88;
      _x = 1.0;
      user_texture_id = local_70;
      ImVec2::ImVec2(this_00,1.0,0.0);
      local_80 = operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                           0.0);
      local_78 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                           (ImVec2 *)0x164c43);
      this_01 = &local_a8;
      ImVec2::ImVec2(this_01,_x,0.0);
      local_a0 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                           (ImVec2 *)0x164c87);
      local_98 = operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                           0.0);
      local_90 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                           (ImVec2 *)0x164cc4);
      iVar2 = local_24;
      ImDrawList::AddImage
                (in_stack_fffffffffffffe80,user_texture_id,(ImVec2 *)local_10,this_01,
                 (ImVec2 *)CONCAT44(_x,in_stack_fffffffffffffe60),this_00,IVar3);
      this_02 = (ImDrawList *)local_c0;
      ImVec2::ImVec2((ImVec2 *)this_02,2.0,0.0);
      local_c0._8_8_ = operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffe4c,iVar2),0.0);
      local_c0._16_8_ =
           operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe4c,iVar2),(ImVec2 *)0x164d83);
      this_03 = &local_e0;
      ImVec2::ImVec2(this_03,2.0,0.0);
      IVar3 = (ImU32)this_03;
      local_d8 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe4c,iVar2),(ImVec2 *)0x164dbf);
      local_d0 = operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffe4c,iVar2),0.0);
      local_c8 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe4c,iVar2),(ImVec2 *)0x164dfc);
      ImDrawList::AddImage
                (this_02,user_texture_id,(ImVec2 *)local_10,this_01,
                 (ImVec2 *)CONCAT44(_x,in_stack_fffffffffffffe60),this_00,IVar3);
      operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffe4c,local_24),0.0);
      operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe4c,local_24),(ImVec2 *)0x164e88);
      ImDrawList::AddImage
                (this_02,user_texture_id,(ImVec2 *)local_10,this_01,
                 (ImVec2 *)CONCAT44(_x,in_stack_fffffffffffffe60),this_00,IVar3);
      operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffe4c,local_20),0.0);
      operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe4c,local_20),(ImVec2 *)0x164f1a);
      ImDrawList::AddImage
                (this_02,user_texture_id,(ImVec2 *)local_10,this_01,
                 (ImVec2 *)CONCAT44(_x,in_stack_fffffffffffffe60),this_00,IVar3);
      ImDrawList::PopTextureID(in_stack_fffffffffffffe50);
    }
  }
  return;
}

Assistant:

void ImGui::RenderMouseCursor(ImDrawList* draw_list, ImVec2 pos, float scale, ImGuiMouseCursor mouse_cursor, ImU32 col_fill, ImU32 col_border, ImU32 col_shadow)
{
    if (mouse_cursor == ImGuiMouseCursor_None)
        return;
    IM_ASSERT(mouse_cursor > ImGuiMouseCursor_None && mouse_cursor < ImGuiMouseCursor_COUNT);

    ImFontAtlas* font_atlas = draw_list->_Data->Font->ContainerAtlas;
    ImVec2 offset, size, uv[4];
    if (font_atlas->GetMouseCursorTexData(mouse_cursor, &offset, &size, &uv[0], &uv[2]))
    {
        pos -= offset;
        const ImTextureID tex_id = font_atlas->TexID;
        draw_list->PushTextureID(tex_id);
        draw_list->AddImage(tex_id, pos + ImVec2(1, 0) * scale, pos + (ImVec2(1, 0) + size) * scale,    uv[2], uv[3], col_shadow);
        draw_list->AddImage(tex_id, pos + ImVec2(2, 0) * scale, pos + (ImVec2(2, 0) + size) * scale,    uv[2], uv[3], col_shadow);
        draw_list->AddImage(tex_id, pos,                        pos + size * scale,                     uv[2], uv[3], col_border);
        draw_list->AddImage(tex_id, pos,                        pos + size * scale,                     uv[0], uv[1], col_fill);
        draw_list->PopTextureID();
    }
}